

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O3

Reg ra_dest(ASMState *as,IRIns *ir,RegSet allow)

{
  byte bVar1;
  int iVar2;
  Reg r;
  ulong uVar3;
  
  bVar1 = (ir->field_1).r;
  r = (Reg)bVar1;
  if (-1 < (char)bVar1) {
    iVar2 = 1 << (bVar1 & 0x1f);
    uVar3._0_4_ = as->freeset;
    uVar3._4_4_ = as->modset;
    uVar3 = CONCAT44(iVar2,iVar2) | uVar3;
    as->freeset = (int)uVar3;
    as->modset = (int)(uVar3 >> 0x20);
    goto LAB_0013f7f1;
  }
  if (bVar1 < 0xfd) {
    r = bVar1 & 0x7f;
    if (((as->freeset & allow) >> (bVar1 & 0x1f) & 1) == 0) goto LAB_0013f7e1;
    as->modset = as->modset | 1 << ((byte)r & 0x1f);
  }
  else {
LAB_0013f7e1:
    r = ra_scratch(as,allow);
  }
  (ir->field_1).r = (uint8_t)r;
LAB_0013f7f1:
  if ((ir->field_1).s != 0) {
    emit_storeofs(as,ir,r,4,(uint)(ir->field_1).s << 2);
  }
  return r;
}

Assistant:

static Reg ra_dest(ASMState *as, IRIns *ir, RegSet allow)
{
  Reg dest = ir->r;
  if (ra_hasreg(dest)) {
    ra_free(as, dest);
    ra_modified(as, dest);
  } else {
    if (ra_hashint(dest) && rset_test((as->freeset&allow), ra_gethint(dest))) {
      dest = ra_gethint(dest);
      ra_modified(as, dest);
      RA_DBGX((as, "dest           $r", dest));
    } else {
      dest = ra_scratch(as, allow);
    }
    ir->r = dest;
  }
  if (LJ_UNLIKELY(ra_hasspill(ir->s))) ra_save(as, ir, dest);
  return dest;
}